

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O3

utf8proc_ssize_t duckdb::utf8proc_encode_char(utf8proc_int32_t uc,utf8proc_uint8_t *dst)

{
  byte bVar1;
  
  if (-1 < uc) {
    bVar1 = (byte)uc;
    if ((uint)uc < 0x80) {
      *dst = bVar1;
      return 1;
    }
    if ((uint)uc < 0x800) {
      *dst = (byte)((uint)uc >> 6) | 0xc0;
      dst[1] = bVar1 & 0x3f | 0x80;
      return 2;
    }
    if ((uint)uc < 0x10000) {
      *dst = (byte)((uint)uc >> 0xc) | 0xe0;
      dst[1] = (byte)((uint)uc >> 6) & 0x3f | 0x80;
      dst[2] = bVar1 & 0x3f | 0x80;
      return 3;
    }
    if ((uint)uc < 0x110000) {
      *dst = (byte)((uint)uc >> 0x12) | 0xf0;
      dst[1] = (byte)((uint)uc >> 0xc) & 0x3f | 0x80;
      dst[2] = (byte)((uint)uc >> 6) & 0x3f | 0x80;
      dst[3] = bVar1 & 0x3f | 0x80;
      return 4;
    }
  }
  return 0;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_encode_char(utf8proc_int32_t uc, utf8proc_uint8_t *dst) {
  if (uc < 0x00) {
    return 0;
  } else if (uc < 0x80) {
    dst[0] = (utf8proc_uint8_t) uc;
    return 1;
  } else if (uc < 0x800) {
    dst[0] = (utf8proc_uint8_t)(0xC0 + (uc >> 6));
    dst[1] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 2;
    // Note: we allow encoding 0xd800-0xdfff here, so as not to change
    // the API, however, these are actually invalid in UTF-8
  } else if (uc < 0x10000) {
    dst[0] = (utf8proc_uint8_t)(0xE0 + (uc >> 12));
    dst[1] = (utf8proc_uint8_t)(0x80 + ((uc >> 6) & 0x3F));
    dst[2] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 3;
  } else if (uc < 0x110000) {
    dst[0] = (utf8proc_uint8_t)(0xF0 + (uc >> 18));
    dst[1] = (utf8proc_uint8_t)(0x80 + ((uc >> 12) & 0x3F));
    dst[2] = (utf8proc_uint8_t)(0x80 + ((uc >> 6) & 0x3F));
    dst[3] = (utf8proc_uint8_t)(0x80 + (uc & 0x3F));
    return 4;
  } else return 0;
}